

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O2

Flow __thiscall Dinic::getFlow(Dinic *this,int _S,int _T)

{
  pointer pEVar1;
  pointer piVar2;
  bool bVar3;
  Edge *x;
  pointer pEVar4;
  pointer piVar5;
  Flow FVar6;
  long lVar7;
  
  this->S = _S;
  this->T = _T;
  pEVar1 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  for (pEVar4 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                super__Vector_impl_data._M_start; pEVar4 != pEVar1; pEVar4 = pEVar4 + 1) {
    pEVar4->flow = 0;
  }
  lVar7 = 0;
  while (bVar3 = levels(this), bVar3) {
    piVar2 = (this->pt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar5 = (this->pt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar5 != piVar2; piVar5 = piVar5 + 1) {
      *piVar5 = 0;
    }
    do {
      FVar6 = blocking(this,this->S,1000000000000000);
      lVar7 = lVar7 + FVar6;
    } while (FVar6 != 0);
  }
  return lVar7;
}

Assistant:

Flow getFlow(int _S, int _T) {
        S = _S, T = _T;
        Flow res = 0;
        for (auto &x : e) x.flow = 0;
        while (levels()) {
            fill(pt.begin(), pt.end(), 0);
            while (ll cur = blocking(S, INF))
                res += cur;
        }
        return res;
    }